

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

void Vec_VecFreeP(Vec_Vec_t **p)

{
  if (*p != (Vec_Vec_t *)0x0) {
    Vec_VecFree(*p);
    *p = (Vec_Vec_t *)0x0;
  }
  return;
}

Assistant:

static inline void Vec_VecFreeP( Vec_Vec_t ** p )
{
    if ( *p == NULL )
        return;
    Vec_VecFree( *p );
    *p = NULL;
}